

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O1

RunResult __thiscall
wabt::interp::Thread::DoBinop<unsigned_long,unsigned_long>
          (Thread *this,BinopTrapFunc<unsigned_long,_unsigned_long> *f,Ptr *out_trap)

{
  RunResult RVar1;
  unsigned_long uVar2;
  unsigned_long uVar3;
  unsigned_long out;
  string msg;
  unsigned_long local_50;
  string local_48;
  
  uVar2 = Pop<unsigned_long>(this);
  uVar3 = Pop<unsigned_long>(this);
  local_48._M_string_length = 0;
  local_48.field_2._M_local_buf[0] = '\0';
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  RVar1 = (*f)(uVar3,uVar2,&local_50,&local_48);
  if (RVar1 == Trap) {
    DoBinop<unsigned_long,unsigned_long>();
    RVar1 = Trap;
  }
  else {
    Push<unsigned_long>(this,local_50);
    RVar1 = Ok;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  return RVar1;
}

Assistant:

RunResult Thread::DoBinop(BinopTrapFunc<R, T> f, Trap::Ptr* out_trap) {
  auto rhs = Pop<T>();
  auto lhs = Pop<T>();
  T out;
  std::string msg;
  TRAP_IF(f(lhs, rhs, &out, &msg) == RunResult::Trap, msg);
  Push<R>(out);
  return RunResult::Ok;
}